

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

void __thiscall
Imf_3_4::IDManifest::serialize(IDManifest *this,vector<char,_std::allocator<char>_> *data)

{
  long *plVar1;
  char cVar2;
  undefined4 uVar3;
  bool bVar4;
  pointer piVar5;
  pointer ppVar6;
  vector<char,_std::allocator<char>_> *pvVar7;
  int iVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  pointer pCVar11;
  pair<int,_int> *ppVar12;
  undefined8 *puVar13;
  ulong uVar14;
  size_t sVar15;
  _Base_ptr p_Var16;
  pointer pCVar17;
  _Rb_tree_node_base *p_Var18;
  ArgExc *this_00;
  int iVar19;
  const_iterator i;
  pointer pbVar20;
  ulong uVar21;
  _Base_ptr p_Var22;
  uint uVar23;
  pair<int,_int> pVar24;
  ulong uVar25;
  pointer ppVar26;
  uint64_t uVar27;
  pair<int,_int> pVar28;
  pair<int,_int> pVar29;
  pair<int,_int> pVar30;
  pair<int,_int> pVar31;
  pair<int,_int> pVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  _Rb_tree_header *p_Var38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  char *outPtr;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> RLEmapping;
  vector<char,_std::allocator<char>_> storageSchemes;
  vector<int,_std::allocator<int>_> stringIndices;
  string prevString;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sortedIndices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefixedStringList;
  indexedStringSet stringSet;
  pair<int,_int> *local_198;
  long local_190;
  pair<int,_int> local_188 [2];
  undefined1 local_178 [16];
  pair<int,_int> local_168;
  pair<int,_int> pStack_160;
  vector<char,_std::allocator<char>_> local_158;
  vector<int,_std::allocator<int>_> local_130;
  undefined8 uStack_118;
  pointer local_110;
  IDManifest *local_108;
  ulong local_100;
  byte local_f8 [4];
  undefined4 uStack_f4;
  long local_f0;
  pair<int,_int> local_e8 [2];
  undefined1 *local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_b8;
  ulong local_a0;
  vector<char,_std::allocator<char>_> *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree_node_base *local_78;
  size_t local_70;
  long local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar17 = (this->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar11 = (this->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_108 = this;
  local_98 = data;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pCVar11 != pCVar17) {
    uVar37 = 0;
    do {
      p_Var10 = pCVar17[uVar37]._table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var10 != &pCVar17[uVar37]._table._M_t._M_impl.super__Rb_tree_header)
      {
        do {
          p_Var22 = p_Var10[1]._M_parent;
          if (p_Var10[1]._M_left != p_Var22) {
            lVar35 = 0;
            uVar21 = 0;
            do {
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)&local_60,(key_type *)((long)&p_Var22->_M_color + lVar35));
              *pmVar9 = *pmVar9 + 1;
              uVar21 = uVar21 + 1;
              p_Var22 = p_Var10[1]._M_parent;
              lVar35 = lVar35 + 0x20;
            } while (uVar21 < (ulong)((long)p_Var10[1]._M_left - (long)p_Var22 >> 5));
            pCVar17 = (local_108->_manifest).
                      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 !=
                 &pCVar17[uVar37]._table._M_t._M_impl.super__Rb_tree_header);
        pCVar11 = (local_108->_manifest).
                  super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (ulong)(((long)pCVar11 - (long)pCVar17 >> 4) * 0x4ec4ec4ec4ec4ec5));
  }
  p_Var38 = &local_60._M_impl.super__Rb_tree_header;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,local_60._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)&local_d8);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&local_b8,local_60._M_impl.super__Rb_tree_header._M_node_count,
             (allocator_type *)&local_d8);
  local_d8 = &local_c8;
  local_d0 = (_Base_ptr)0x0;
  local_c8 = 0;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var38) {
    lVar35 = 0;
    p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (lVar35 == 0) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   local_90.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        p_Var18 = p_Var10 + 1;
        p_Var22 = (_Base_ptr)0x0;
        do {
          if (((local_d0 == p_Var22) || (p_Var10[1]._M_parent <= p_Var22)) ||
             (local_d8[(long)p_Var22] != *(char *)((long)&p_Var22->_M_color + *(long *)p_Var18)))
          break;
          p_Var22 = (_Base_ptr)((long)&p_Var22->_M_color + 1);
        } while (p_Var22 != (_Base_ptr)0xffff);
        if (local_d0 < (_Base_ptr)0x100) {
          local_178._0_8_ = &local_168;
          std::__cxx11::string::_M_construct((ulong)local_178,'\x01');
          std::__cxx11::string::substr((ulong)&local_158,(ulong)p_Var18);
          pVar24.first = 0xf;
          pVar24.second = 0;
          if ((pair<int,_int> *)local_178._0_8_ != &local_168) {
            pVar24 = local_168;
          }
          if ((ulong)pVar24 <
              (ulong)((long)local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish + local_178._8_8_)) {
            pVar32.first = 0xf;
            pVar32.second = 0;
            if ((pointer *)
                local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                &local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
              pVar32 = (pair<int,_int>)
                       local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            if ((ulong)pVar32 <
                (ulong)((long)local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish + local_178._8_8_))
            goto LAB_00180032;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,local_178._0_8_)
            ;
          }
          else {
LAB_00180032:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_178,
                                 (ulong)local_158.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
          }
          local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          plVar1 = puVar13 + 2;
          if ((pointer *)*puVar13 == (pointer *)plVar1) {
            local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*plVar1;
            uStack_118 = puVar13[3];
          }
          else {
            local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*plVar1;
            local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)*puVar13;
          }
          local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)puVar13[1];
          *puVar13 = plVar1;
          puVar13[1] = 0;
          *(undefined1 *)plVar1 = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar35),(string *)&local_130);
          if ((pointer *)
              local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
          }
          if ((pointer *)
              local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
          }
          pVar24 = local_168;
          pVar32 = (pair<int,_int>)local_178._0_8_;
          if ((pair<int,_int> *)local_178._0_8_ == &local_168) goto LAB_001802f7;
        }
        else {
          local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct((ulong)&local_158,'\x01');
          local_198 = local_188;
          std::__cxx11::string::_M_construct((ulong)&local_198,'\x01');
          pVar28.first = 0xf;
          pVar28.second = 0;
          if ((pointer *)
              local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            pVar28 = (pair<int,_int>)
                     local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          }
          if ((ulong)pVar28 <
              (ulong)(local_190 +
                     (long)local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish)) {
            pVar29.first = 0xf;
            pVar29.second = 0;
            if (local_198 != local_188) {
              pVar29 = local_188[0];
            }
            if ((ulong)pVar29 <
                (ulong)(local_190 +
                       (long)local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish)) goto LAB_0017ffab;
            ppVar12 = (pair<int,_int> *)
                      std::__cxx11::string::replace
                                ((ulong)&local_198,0,(char *)0x0,
                                 (ulong)local_158.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
          }
          else {
LAB_0017ffab:
            ppVar12 = (pair<int,_int> *)
                      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_198);
          }
          pVar24 = (pair<int,_int>)(ppVar12 + 2);
          if (*ppVar12 == pVar24) {
            local_168 = *(pair<int,_int> *)pVar24;
            pStack_160 = ppVar12[3];
            pVar32 = (pair<int,_int>)&local_168;
          }
          else {
            local_168 = *(pair<int,_int> *)pVar24;
            pVar32 = *ppVar12;
          }
          local_178._8_4_ = ppVar12[1].first;
          local_178._12_4_ = ppVar12[1].second;
          local_178._0_4_ = pVar32.first;
          local_178._4_4_ = pVar32.second;
          *ppVar12 = pVar24;
          ppVar12[1].first = 0;
          ppVar12[1].second = 0;
          *(undefined1 *)pVar24 = 0;
          std::__cxx11::string::substr((ulong)local_f8,(ulong)p_Var18);
          pVar30.first = 0xf;
          pVar30.second = 0;
          if ((pair<int,_int> *)local_178._0_8_ != &local_168) {
            pVar30 = local_168;
          }
          ppVar12 = (pair<int,_int> *)
                    CONCAT44(uStack_f4,
                             CONCAT13(local_f8[3],
                                      CONCAT12(local_f8[2],CONCAT11(local_f8[1],local_f8[0]))));
          pVar24 = (pair<int,_int>)((long)(int *)local_178._8_8_ + local_f0);
          if ((ulong)pVar30 < (ulong)pVar24) {
            pVar31.first = 0xf;
            pVar31.second = 0;
            if (ppVar12 != local_e8) {
              pVar31 = local_e8[0];
            }
            if ((ulong)pVar31 < (ulong)pVar24) goto LAB_00180105;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,local_178._0_8_);
          }
          else {
LAB_00180105:
            puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_178,(ulong)ppVar12);
          }
          local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          plVar1 = puVar13 + 2;
          if ((pointer *)*puVar13 == (pointer *)plVar1) {
            local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*plVar1;
            uStack_118 = puVar13[3];
          }
          else {
            local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*plVar1;
            local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)*puVar13;
          }
          local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)puVar13[1];
          *puVar13 = plVar1;
          puVar13[1] = 0;
          *(undefined1 *)plVar1 = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar35),(string *)&local_130);
          if ((pointer *)
              local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
          }
          ppVar12 = (pair<int,_int> *)
                    CONCAT44(uStack_f4,
                             CONCAT13(local_f8[3],
                                      CONCAT12(local_f8[2],CONCAT11(local_f8[1],local_f8[0]))));
          if (ppVar12 != local_e8) {
            operator_delete(ppVar12,(long)local_e8[0] + 1);
          }
          if ((pair<int,_int> *)local_178._0_8_ != &local_168) {
            operator_delete((void *)local_178._0_8_,(long)local_168 + 1);
          }
          if (local_198 != local_188) {
            operator_delete(local_198,(long)local_188[0] + 1);
          }
          pVar24 = (pair<int,_int>)
                   local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pVar32 = (pair<int,_int>)
                   local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((pointer *)
              local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              &local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) goto LAB_001802f7;
        }
        operator_delete((void *)pVar32,(long)pVar24 + 1);
      }
LAB_001802f7:
      std::__cxx11::string::_M_assign((string *)&local_d8);
      local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar35].first = -p_Var10[2]._M_color;
      local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar35].second = (_Rb_tree_color)lVar35;
      p_Var10[2]._M_color = (_Rb_tree_color)lVar35;
      lVar35 = lVar35 + 1;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var38);
  }
  ppVar26 = local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar37 = (long)local_b8.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar35 = 0x3f;
    if (uVar37 != 0) {
      for (; uVar37 >> lVar35 == 0; lVar35 = lVar35 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b8.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_b8.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar35 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar26);
  }
  ppVar6 = local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar26 = local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  auVar51 = _DAT_001b2460;
  uVar37 = (long)local_b8.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_b8.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  if (local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar21 = 0;
  }
  else {
    uVar21 = 0x80;
    if (uVar37 < 0x80) {
      uVar21 = uVar37;
    }
    uVar21 = uVar21 + (uVar21 == 0);
    lVar35 = uVar21 - 1;
    auVar40._8_4_ = (int)lVar35;
    auVar40._0_8_ = lVar35;
    auVar40._12_4_ = (int)((ulong)lVar35 >> 0x20);
    uVar25 = 0;
    auVar40 = auVar40 ^ _DAT_001b2460;
    auVar44 = _DAT_001b3330;
    auVar45 = _DAT_001b3230;
    do {
      auVar50 = auVar45 ^ auVar51;
      iVar8 = auVar40._4_4_;
      if ((bool)(~(auVar50._4_4_ == iVar8 && auVar40._0_4_ < auVar50._0_4_ || iVar8 < auVar50._4_4_)
                & 1)) {
        *(undefined4 *)
         ((long)&(local_b8.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->first + uVar25) = 1;
      }
      if ((auVar50._12_4_ != auVar40._12_4_ || auVar50._8_4_ <= auVar40._8_4_) &&
          auVar50._12_4_ <= auVar40._12_4_) {
        *(undefined4 *)
         ((long)&local_b8.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].first + uVar25) = 1;
      }
      auVar50 = auVar44 ^ auVar51;
      iVar19 = auVar50._4_4_;
      if (iVar19 <= iVar8 && (iVar19 != iVar8 || auVar50._0_4_ <= auVar40._0_4_)) {
        *(undefined4 *)
         ((long)&local_b8.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[2].first + uVar25) = 1;
        *(undefined4 *)
         ((long)&local_b8.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[3].first + uVar25) = 1;
      }
      lVar35 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + 4;
      auVar45._8_8_ = lVar35 + 4;
      lVar35 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 4;
      auVar44._8_8_ = lVar35 + 4;
      uVar25 = uVar25 + 0x20;
    } while (((int)uVar21 * 8 + 0x18U & 0xfe0) != uVar25);
  }
  auVar45 = _DAT_001b3330;
  auVar44 = _DAT_001b3230;
  auVar51 = _DAT_001b2460;
  uVar25 = 0x4000;
  if (uVar37 < 0x4000) {
    uVar25 = uVar37;
  }
  lVar35 = uVar25 - uVar21;
  uVar14 = uVar21;
  if (uVar21 <= uVar25 && lVar35 != 0) {
    lVar33 = lVar35 + -1;
    auVar50._8_4_ = (int)lVar33;
    auVar50._0_8_ = lVar33;
    auVar50._12_4_ = (int)((ulong)lVar33 >> 0x20);
    uVar34 = 0;
    auVar50 = auVar50 ^ _DAT_001b2460;
    do {
      auVar46._8_4_ = (int)uVar34;
      auVar46._0_8_ = uVar34;
      auVar46._12_4_ = (int)(uVar34 >> 0x20);
      auVar40 = (auVar46 | auVar44) ^ auVar51;
      iVar8 = auVar50._4_4_;
      if ((bool)(~(auVar40._4_4_ == iVar8 && auVar50._0_4_ < auVar40._0_4_ || iVar8 < auVar40._4_4_)
                & 1)) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21 + uVar34].first = 2;
      }
      if ((auVar40._12_4_ != auVar50._12_4_ || auVar40._8_4_ <= auVar50._8_4_) &&
          auVar40._12_4_ <= auVar50._12_4_) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21 + uVar34 + 1].first = 2;
      }
      auVar40 = (auVar46 | auVar45) ^ auVar51;
      iVar19 = auVar40._4_4_;
      if (iVar19 <= iVar8 && (iVar19 != iVar8 || auVar40._0_4_ <= auVar50._0_4_)) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21 + uVar34 + 2].first = 2;
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21 + uVar34 + 3].first = 2;
      }
      uVar34 = uVar34 + 4;
      uVar14 = uVar25;
    } while ((lVar35 + 3U & 0xfffffffffffffffc) != uVar34);
  }
  auVar45 = _DAT_001b3330;
  auVar44 = _DAT_001b3230;
  auVar51 = _DAT_001b2460;
  uVar21 = 0x200000;
  if (uVar37 < 0x200000) {
    uVar21 = uVar37;
  }
  lVar35 = uVar21 - uVar14;
  uVar25 = uVar14;
  if (uVar14 <= uVar21 && lVar35 != 0) {
    lVar33 = lVar35 + -1;
    auVar41._8_4_ = (int)lVar33;
    auVar41._0_8_ = lVar33;
    auVar41._12_4_ = (int)((ulong)lVar33 >> 0x20);
    uVar34 = 0;
    auVar41 = auVar41 ^ _DAT_001b2460;
    do {
      auVar47._8_4_ = (int)uVar34;
      auVar47._0_8_ = uVar34;
      auVar47._12_4_ = (int)(uVar34 >> 0x20);
      auVar40 = (auVar47 | auVar44) ^ auVar51;
      iVar8 = auVar41._4_4_;
      if ((bool)(~(auVar40._4_4_ == iVar8 && auVar41._0_4_ < auVar40._0_4_ || iVar8 < auVar40._4_4_)
                & 1)) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar14 + uVar34].first = 3;
      }
      if ((auVar40._12_4_ != auVar41._12_4_ || auVar40._8_4_ <= auVar41._8_4_) &&
          auVar40._12_4_ <= auVar41._12_4_) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar14 + uVar34 + 1].first = 3;
      }
      auVar40 = (auVar47 | auVar45) ^ auVar51;
      iVar19 = auVar40._4_4_;
      if (iVar19 <= iVar8 && (iVar19 != iVar8 || auVar40._0_4_ <= auVar41._0_4_)) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar14 + uVar34 + 2].first = 3;
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar14 + uVar34 + 3].first = 3;
      }
      uVar34 = uVar34 + 4;
      uVar25 = uVar21;
    } while ((lVar35 + 3U & 0xfffffffffffffffc) != uVar34);
  }
  auVar45 = _DAT_001b3330;
  auVar44 = _DAT_001b3230;
  auVar51 = _DAT_001b2460;
  uVar21 = 0x10000000;
  if (uVar37 < 0x10000000) {
    uVar21 = uVar37;
  }
  lVar35 = uVar21 - uVar25;
  uVar14 = uVar25;
  if (uVar25 <= uVar21 && lVar35 != 0) {
    lVar33 = lVar35 + -1;
    auVar42._8_4_ = (int)lVar33;
    auVar42._0_8_ = lVar33;
    auVar42._12_4_ = (int)((ulong)lVar33 >> 0x20);
    uVar34 = 0;
    auVar42 = auVar42 ^ _DAT_001b2460;
    do {
      auVar48._8_4_ = (int)uVar34;
      auVar48._0_8_ = uVar34;
      auVar48._12_4_ = (int)(uVar34 >> 0x20);
      auVar40 = (auVar48 | auVar44) ^ auVar51;
      iVar8 = auVar42._4_4_;
      if ((bool)(~(auVar40._4_4_ == iVar8 && auVar42._0_4_ < auVar40._0_4_ || iVar8 < auVar40._4_4_)
                & 1)) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar25 + uVar34].first = 4;
      }
      if ((auVar40._12_4_ != auVar42._12_4_ || auVar40._8_4_ <= auVar42._8_4_) &&
          auVar40._12_4_ <= auVar42._12_4_) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar25 + uVar34 + 1].first = 4;
      }
      auVar40 = (auVar48 | auVar45) ^ auVar51;
      iVar19 = auVar40._4_4_;
      if (iVar19 <= iVar8 && (iVar19 != iVar8 || auVar40._0_4_ <= auVar42._0_4_)) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar25 + uVar34 + 2].first = 4;
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar25 + uVar34 + 3].first = 4;
      }
      uVar34 = uVar34 + 4;
      uVar14 = uVar21;
    } while ((lVar35 + 3U & 0xfffffffffffffffc) != uVar34);
  }
  auVar45 = _DAT_001b3330;
  auVar44 = _DAT_001b3230;
  auVar51 = _DAT_001b2460;
  lVar35 = uVar37 - uVar14;
  if (uVar14 <= uVar37 && lVar35 != 0) {
    lVar33 = lVar35 + -1;
    auVar43._8_4_ = (int)lVar33;
    auVar43._0_8_ = lVar33;
    auVar43._12_4_ = (int)((ulong)lVar33 >> 0x20);
    uVar21 = 0;
    auVar43 = auVar43 ^ _DAT_001b2460;
    do {
      auVar49._8_4_ = (int)uVar21;
      auVar49._0_8_ = uVar21;
      auVar49._12_4_ = (int)(uVar21 >> 0x20);
      auVar40 = (auVar49 | auVar44) ^ auVar51;
      iVar8 = auVar43._4_4_;
      if ((bool)(~(auVar40._4_4_ == iVar8 && auVar43._0_4_ < auVar40._0_4_ || iVar8 < auVar40._4_4_)
                & 1)) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar14 + uVar21].first = 5;
      }
      if ((auVar40._12_4_ != auVar43._12_4_ || auVar40._8_4_ <= auVar43._8_4_) &&
          auVar40._12_4_ <= auVar43._12_4_) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar14 + uVar21 + 1].first = 5;
      }
      auVar40 = (auVar49 | auVar45) ^ auVar51;
      iVar19 = auVar40._4_4_;
      if (iVar19 <= iVar8 && (iVar19 != iVar8 || auVar40._0_4_ <= auVar43._0_4_)) {
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar14 + uVar21 + 2].first = 5;
        local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar14 + uVar21 + 3].first = 5;
      }
      uVar21 = uVar21 + 4;
    } while ((lVar35 + 3U & 0xfffffffffffffffc) != uVar21);
  }
  if (local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar35 = 0x3f;
    if (uVar37 != 0) {
      for (; uVar37 >> lVar35 == 0; lVar35 = lVar35 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b8.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_b8.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar35 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar26,ppVar6);
    ppVar26 = local_b8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_130,
             (long)ppVar26 -
             (long)local_b8.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_178);
  local_178 = (undefined1  [16])0x0;
  local_168.first = 0;
  local_168.second = 0;
  if (local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_178,1);
    ppVar26 = local_b8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    piVar5 = local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    iVar8 = (local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second;
    *(int *)local_178._0_8_ = iVar8;
    *(int *)(local_178._0_8_ + 4) = iVar8;
    if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,0xff,
             ((ulong)((long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                     (-4 - (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start)) & 0xfffffffffffffffc) + 4);
      iVar8 = ppVar26->second;
    }
    *(undefined4 *)((long)piVar5 + (long)iVar8 * 4) = 0;
    if (8 < (ulong)((long)local_b8.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar26)) {
      uVar37 = (ulong)(*(int *)((long)piVar5 + (long)ppVar26->second * 4) + 1);
      uVar21 = 1;
      do {
        if (ppVar26[uVar21].second == (int)uVar37) {
          ((pair<int,_int> *)(local_178._8_8_ + -8))->second = (int)uVar37;
        }
        else {
          local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(ppVar26[uVar21].second,ppVar26[uVar21].second);
          if ((pair<int,_int>)local_178._8_8_ == local_168) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>const&>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_178,
                       (iterator)local_178._8_8_,(pair<int,_int> *)&local_158);
            ppVar26 = local_b8.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *(pointer *)local_178._8_8_ =
                 local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_178._8_8_ = (pair<int,_int> *)(local_178._8_8_ + 8);
            ppVar26 = local_b8.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        *(int *)((long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)ppVar26[uVar21].second * 4) =
             (int)uVar21;
        uVar14 = (ulong)ppVar26[uVar21].second;
        uVar37 = (ulong)((long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
        iVar8 = (int)uVar37;
        uVar23 = ppVar26[uVar21].second + 1;
        uVar34 = (ulong)uVar23;
        uVar25 = uVar14;
        if ((int)uVar23 <= iVar8) {
          uVar34 = uVar37 & 0xffffffff;
        }
        do {
          uVar25 = uVar25 + 1;
          uVar37 = uVar34;
          if ((long)iVar8 <= (long)uVar25) break;
          uVar37 = (ulong)((int)uVar14 + 1);
          uVar14 = uVar37;
        } while (-1 < *(int *)((long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start + uVar25 * 4));
        uVar21 = uVar21 + 1;
      } while (uVar21 < (ulong)((long)local_b8.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar26 >>
                               3));
    }
  }
  if (local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar8 = 0x10;
  }
  else {
    iVar8 = 4;
    pbVar20 = local_90.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar27 = pbVar20->_M_string_length;
      sVar15 = anon_unknown_4::getVariableLengthIntegerSize(uVar27);
      iVar8 = (int)sVar15 + (int)uVar27 + iVar8;
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             local_90.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    iVar8 = iVar8 + 0xc;
  }
  iVar8 = (local_178._8_4_ - local_178._0_4_ & 0xfffffff8) + iVar8;
  local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pCVar17 = (local_108->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_108->_manifest).
      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar17) {
    uVar37 = 0;
    do {
      local_100 = uVar37 * 0xd0;
      p_Var38 = &pCVar17[uVar37]._channels._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = pCVar17[uVar37]._channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar36 = 4;
      iVar19 = 4;
      local_110 = pCVar17;
      local_a0 = uVar37;
      if ((_Rb_tree_header *)p_Var10 != p_Var38) {
        iVar19 = 4;
        do {
          p_Var22 = p_Var10[1]._M_parent;
          sVar15 = anon_unknown_4::getVariableLengthIntegerSize((uint64_t)p_Var22);
          iVar19 = (int)sVar15 + (int)p_Var22 + iVar19;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var38);
      }
      local_110 = (pointer)(&(local_110->_channels)._M_t._M_impl.field_0x0 + local_100);
      p_Var22 = ((_Rb_tree_node_base *)((long)local_110 + 0x20))->_M_left;
      p_Var10 = ((_Rb_tree_node_base *)((long)local_110 + 0x20))->_M_right;
      if (p_Var22 != p_Var10) {
        iVar36 = 4;
        p_Var16 = p_Var22;
        do {
          local_100 = CONCAT44(local_100._4_4_,(int)p_Var16->_M_parent + iVar36);
          sVar15 = anon_unknown_4::getVariableLengthIntegerSize((uint64_t)p_Var16->_M_parent);
          iVar36 = (int)sVar15 + (int)local_100;
          p_Var16 = p_Var16 + 1;
        } while (p_Var16 != p_Var10);
      }
      iVar8 = iVar8 + iVar19 + iVar36 +
              *(int *)&((_Rb_tree_node_base *)((long)local_110 + 0x40))->_M_right +
              *(int *)&((_Rb_tree_node_base *)((long)local_110 + 0x60))->_M_right + 0xe;
      p_Var16 = ((_Rb_tree_node_base *)((long)local_110 + 0xa0))->_M_parent;
      local_78 = (_Rb_tree_node_base *)&((_Rb_tree_node_base *)((long)local_110 + 0x80))->_M_right;
      if (p_Var16 == local_78) {
        uVar37 = 0;
LAB_00180d24:
        pCVar17 = local_110;
        if (uVar37 < (ulong)((long)((_Rb_tree_node_base *)((long)local_110 + 0xa0))->_M_right << 2))
        {
          local_198 = (pair<int,_int> *)CONCAT71(local_198._1_7_,2);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&local_158,(char *)&local_198);
          iVar8 = iVar8 + (int)uVar37;
        }
        else {
          local_198 = (pair<int,_int> *)CONCAT71(local_198._1_7_,1);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&local_158,(char *)&local_198);
          iVar8 = iVar8 + *(int *)&((_Rb_tree_node_base *)((long)pCVar17 + 0xa0))->_M_right * 4;
        }
      }
      else {
        bVar4 = true;
        uVar37 = 0;
        local_68 = 0;
        do {
          uVar21 = *(long *)(p_Var16 + 1) - local_68;
          local_100 = uVar37;
          local_68 = *(long *)(p_Var16 + 1);
          local_70 = anon_unknown_4::getVariableLengthIntegerSize(uVar21);
          bVar39 = p_Var10 != p_Var22;
          p_Var10 = p_Var22;
          if (bVar39) {
            lVar35 = 0;
            uVar37 = 0;
            do {
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)&local_60,
                                    (key_type *)((long)&(p_Var16[1]._M_parent)->_M_color + lVar35));
              sVar15 = anon_unknown_4::getVariableLengthIntegerSize
                                 ((long)*(int *)((long)local_130.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start +
                                                (long)*pmVar9 * 4));
              iVar8 = iVar8 + (int)sVar15;
              uVar37 = uVar37 + 1;
              p_Var22 = ((_Rb_tree_node_base *)((long)local_110 + 0x20))->_M_left;
              p_Var10 = ((_Rb_tree_node_base *)((long)local_110 + 0x20))->_M_right;
              lVar35 = lVar35 + 0x20;
            } while (uVar37 < (ulong)((long)p_Var10 - (long)p_Var22 >> 5));
          }
          uVar37 = local_100 + local_70;
          bVar4 = (bool)(bVar4 & uVar21 >> 0x20 == 0);
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          pCVar17 = local_110;
        } while (p_Var16 != local_78);
        if (bVar4) goto LAB_00180d24;
        if (uVar37 < (ulong)((long)((_Rb_tree_node_base *)((long)local_110 + 0xa0))->_M_right << 3))
        {
          local_198 = (pair<int,_int> *)CONCAT71(local_198._1_7_,2);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&local_158,(char *)&local_198);
          iVar8 = iVar8 + (int)uVar37;
        }
        else {
          local_198 = (pair<int,_int> *)((ulong)local_198._1_7_ << 8);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&local_158,(char *)&local_198);
          iVar8 = iVar8 + *(int *)&((_Rb_tree_node_base *)((long)pCVar17 + 0xa0))->_M_right * 8;
        }
      }
      uVar37 = local_a0 + 1;
      pCVar17 = (local_108->_manifest).
                super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar37 < (ulong)(((long)(local_108->_manifest).
                                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar17 >> 4
                              ) * 0x4ec4ec4ec4ec4ec5));
  }
  pvVar7 = local_98;
  std::vector<char,_std::allocator<char>_>::resize(local_98,(long)iVar8);
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  lVar35 = 0;
  ppVar12 = (pair<int,_int> *)
            (pvVar7->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    local_198 = ppVar12;
    ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
    *(byte *)&local_198->first = local_f8[lVar35];
    lVar35 = lVar35 + 1;
  } while ((int)lVar35 != 4);
  iVar8 = (int)local_198;
  local_198 = ppVar12;
  (anonymous_namespace)::
  writeStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((char **)&local_198,&local_90,iVar8);
  uVar37 = local_178._8_8_ - local_178._0_8_;
  local_f8[0] = (byte)(uVar37 >> 3);
  local_f8[1] = (char)(uVar37 >> 0xb);
  local_f8[2] = (char)(uVar37 >> 0x13);
  local_f8[3] = (char)(uVar37 >> 0x1b);
  lVar35 = 0;
  do {
    ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
    *(byte *)&local_198->first = local_f8[lVar35];
    lVar35 = lVar35 + 1;
    local_198 = ppVar12;
  } while ((int)lVar35 != 4);
  if (local_178._8_8_ != local_178._0_8_) {
    uVar37 = 0;
    do {
      iVar8 = ((pointer)(local_178._0_8_ + uVar37 * 8))->first;
      local_f8[0] = (byte)iVar8;
      local_f8[1] = (byte)((uint)iVar8 >> 8);
      local_f8[2] = (byte)((uint)iVar8 >> 0x10);
      local_f8[3] = (byte)((uint)iVar8 >> 0x18);
      lVar35 = 0;
      do {
        ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
        *(byte *)&local_198->first = local_f8[lVar35];
        lVar35 = lVar35 + 1;
        local_198 = ppVar12;
      } while ((int)lVar35 != 4);
      iVar8 = ((pointer)(local_178._0_8_ + uVar37 * 8))->second;
      local_f8[0] = (byte)iVar8;
      local_f8[1] = (byte)((uint)iVar8 >> 8);
      local_f8[2] = (byte)((uint)iVar8 >> 0x10);
      local_f8[3] = (byte)((uint)iVar8 >> 0x18);
      lVar35 = 0;
      do {
        ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
        *(byte *)&local_198->first = local_f8[lVar35];
        lVar35 = lVar35 + 1;
        local_198 = ppVar12;
      } while ((int)lVar35 != 4);
      uVar37 = uVar37 + 1;
    } while (uVar37 < (ulong)((long)(local_178._8_8_ - local_178._0_8_) >> 3));
  }
  iVar8 = (int)((ulong)((long)(local_108->_manifest).
                              super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_108->_manifest).
                             super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x3b13b13b;
  local_f8[0] = (byte)iVar8;
  local_f8[1] = (byte)((uint)iVar8 >> 8);
  local_f8[2] = (byte)((uint)iVar8 >> 0x10);
  local_f8[3] = (byte)((uint)iVar8 >> 0x18);
  lVar35 = 0;
  do {
    ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
    *(byte *)&local_198->first = local_f8[lVar35];
    lVar35 = lVar35 + 1;
    local_198 = ppVar12;
  } while ((int)lVar35 != 4);
  pCVar17 = (local_108->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_108->_manifest).
      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar17) {
    uVar37 = 0;
    do {
      uVar3 = (undefined4)pCVar17[uVar37]._channels._M_t._M_impl.super__Rb_tree_header._M_node_count
      ;
      local_f8[0] = (byte)uVar3;
      local_f8[1] = (byte)((uint)uVar3 >> 8);
      local_f8[2] = (byte)((uint)uVar3 >> 0x10);
      local_f8[3] = (byte)((uint)uVar3 >> 0x18);
      lVar35 = 0;
      ppVar12 = local_198;
      do {
        local_198 = ppVar12;
        ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
        *(byte *)&local_198->first = local_f8[lVar35];
        lVar35 = lVar35 + 1;
      } while ((int)lVar35 != 4);
      p_Var18 = pCVar17[uVar37]._channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      auVar51._8_8_ = local_198;
      auVar51._0_8_ = p_Var18;
      p_Var38 = &pCVar17[uVar37]._channels._M_t._M_impl.super__Rb_tree_header;
      local_198 = ppVar12;
      if ((_Rb_tree_header *)p_Var18 != p_Var38) {
        do {
          uVar21 = (long)*(int *)&p_Var18[1]._M_parent;
          do {
            ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
            *(byte *)&local_198->first = (0x7f < uVar21) << 7 | (byte)uVar21 & 0x7f;
            bVar4 = 0x7f < uVar21;
            uVar21 = uVar21 >> 7;
            local_198 = ppVar12;
          } while (bVar4);
          auVar51 = std::_Rb_tree_increment(p_Var18);
          p_Var18 = auVar51._0_8_;
        } while ((_Rb_tree_header *)p_Var18 != p_Var38);
        auVar51._8_8_ = auVar51._8_8_;
        auVar51._0_8_ =
             pCVar17[uVar37]._channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      while (p_Var18 = auVar51._0_8_, (_Rb_tree_header *)p_Var18 != p_Var38) {
        iVar8 = (int)p_Var18[1]._M_parent;
        if (iVar8 != 0) {
          lVar35 = *(long *)(p_Var18 + 1);
          lVar33 = 0;
          do {
            ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
            *(char *)&local_198->first = *(char *)(lVar35 + lVar33);
            lVar33 = lVar33 + 1;
            local_198 = ppVar12;
          } while (iVar8 != (int)lVar33);
        }
        auVar51 = std::_Rb_tree_increment(p_Var18);
      }
      (anonymous_namespace)::
      writeStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((char **)&local_198,&pCVar17[uVar37]._components,auVar51._8_4_);
      *(char *)&local_198->first = (char)pCVar17[uVar37]._lifeTime;
      local_198 = (pair<int,_int> *)((long)&local_198->first + 1);
      anon_unknown_4::writePascalString((char **)&local_198,&pCVar17[uVar37]._hashScheme);
      anon_unknown_4::writePascalString((char **)&local_198,&pCVar17[uVar37]._encodingScheme);
      local_100 = uVar37;
      cVar2 = *(char *)((long)local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar37);
      *(char *)&local_198->first = cVar2;
      uVar3 = (undefined4)pCVar17[uVar37]._table._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_f8[0] = (byte)uVar3;
      local_f8[1] = (byte)((uint)uVar3 >> 8);
      local_f8[2] = (byte)((uint)uVar3 >> 0x10);
      local_f8[3] = (byte)((uint)uVar3 >> 0x18);
      lVar35 = 0;
      local_198 = (pair<int,_int> *)((long)&local_198->first + 1);
      do {
        ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
        *(byte *)&local_198->first = local_f8[lVar35];
        lVar35 = lVar35 + 1;
        local_198 = ppVar12;
      } while ((int)lVar35 != 4);
      p_Var10 = pCVar17[uVar37]._table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_110 = (pointer)&pCVar17[uVar37]._table._M_t._M_impl.super__Rb_tree_header;
      if ((pointer)p_Var10 != local_110) {
        lVar35 = 0;
        do {
          uVar27 = *(long *)(p_Var10 + 1) - lVar35;
          if (cVar2 == '\0') {
            Xdr::write<Imf_3_4::CharPtrIO,char*>((char **)&local_198,uVar27);
          }
          else if (cVar2 == '\x01') {
            local_f8[0] = (byte)uVar27;
            local_f8[1] = (byte)(uVar27 >> 8);
            local_f8[2] = (byte)(uVar27 >> 0x10);
            local_f8[3] = (byte)(uVar27 >> 0x18);
            lVar35 = 0;
            do {
              ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
              *(byte *)&local_198->first = local_f8[lVar35];
              lVar35 = lVar35 + 1;
              local_198 = ppVar12;
            } while ((int)lVar35 != 4);
          }
          else if (cVar2 == '\x02') {
            do {
              ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
              *(byte *)&local_198->first = (0x7f < uVar27) << 7 | (byte)uVar27 & 0x7f;
              bVar4 = 0x7f < uVar27;
              uVar27 = uVar27 >> 7;
              local_198 = ppVar12;
            } while (bVar4);
          }
          lVar35 = *(long *)(p_Var10 + 1);
          if (pCVar17[uVar37]._components.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              pCVar17[uVar37]._components.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar21 = 0;
            do {
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)&local_60,(key_type *)(p_Var10[1]._M_parent + uVar21));
              uVar25 = (long)*(int *)((long)local_130.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     (long)*pmVar9 * 4);
              do {
                ppVar12 = (pair<int,_int> *)((long)&local_198->first + 1);
                *(byte *)&local_198->first = (0x7f < uVar25) << 7 | (byte)uVar25 & 0x7f;
                bVar4 = 0x7f < uVar25;
                uVar25 = uVar25 >> 7;
                local_198 = ppVar12;
              } while (bVar4);
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)((long)pCVar17[uVar37]._components.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pCVar17[uVar37]._components.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((pointer)p_Var10 != local_110);
      }
      uVar37 = local_100 + 1;
      pCVar17 = (local_108->_manifest).
                super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar37 < (ulong)(((long)(local_108->_manifest).
                                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar17 >> 4
                              ) * 0x4ec4ec4ec4ec4ec5));
  }
  if (local_198 ==
      (pair<int,_int> *)
      (local_98->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    if ((pair<int,_int>)
        local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pair<int,_int>)0x0) {
      operator_delete(local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._0_8_,(long)local_168 - local_178._0_8_);
    }
    if ((pointer *)
        local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
    }
    if (local_b8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&local_60);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Error - IDManifest size error");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
IDManifest::serialize (std::vector<char>& data) const
{

    indexedStringSet stringSet;

    //
    // build string map - this turns unique strings into indices
    // the manifest stores the string indices - this allows duplicated
    // strings to point to the same place
    // grabs all the strings regardless of which manifest/mapping they are in
    //
    // at this point we just count the manifest entries
    //
    {
        //
        // over each channel group
        //
        for (size_t m = 0; m < _manifest.size (); ++m)
        {
            // over each mapping
            for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                     _manifest[m]._table.begin ();
                 i != _manifest[m]._table.end ();
                 ++i)
            {
                // over each string in the mapping

                for (size_t s = 0; s < i->second.size (); ++s)
                {
                    stringSet[i->second[s]]++;
                }
            }
        }
    }

    //
    // build compressed string representation - all but first string starts with number of characters to copy from previous string.
    // max 65535 bytes - use two bytes to store if previous string was more than 255 characters, big endian
    //
    vector<string> prefixedStringList (stringSet.size ());

    //
    // also make a sorted list so the most common entry appears first. Keep equally likely entries in numerical order
    //
    vector<pair<int, int>> sortedIndices (stringSet.size ());

    string prevString;
    int    index = 0;
    for (indexedStringSet::iterator i = stringSet.begin ();
         i != stringSet.end ();
         ++i)
    {

        // no prefix on first string - map stores index of each string, so use that rather than a counter;
        if (index == 0) { prefixedStringList[index] = i->first; }
        else
        {
            size_t common = 0;
            while (common < 65535 && common < prevString.size () &&
                   common < i->first.size () &&
                   prevString[common] == i->first[common])
            {
                ++common;
            }

            if (prevString.size () > 255)
            {
                //
                // long previous string - use two bytes to encode number of common chars
                //
                prefixedStringList[index] = string (1, char (common >> 8)) +
                                            string (1, char (common & 255)) +
                                            i->first.substr (common);
            }
            else
            {
                prefixedStringList[index] =
                    string (1, char (common)) + i->first.substr (common);
            }
        }
        prevString = i->first;
        sortedIndices[index].first =
            -i->second; // use negative of count so largest count appears first
        sortedIndices[index].second = index;

        //
        // also, repurpose stringSet so that it maps from string names to indices in the string table
        //
        i->second = index;

        index++;
    }

    sort (sortedIndices.begin (), sortedIndices.end ());

    //
    // the first 1<<7 characters will all be encoded with 1 byte, regardless of how common they are
    // the next 1<<14 characters will be encoded with 2 bytes
    // (a full huffman encode would do this at the bit level, not the byte level)
    //
    // the mapping table can be reduced in size by rewriting the IDs to exploit that
    // can rearrange the IDs to have more long runs by sorting numbers
    // that will need the same number of bytes to encode together
    //
    {
        size_t i = 0;

        for (; i < sortedIndices.size () && i < 1 << 7; ++i)
        {
            sortedIndices[i].first = 1;
        }
        for (; i < sortedIndices.size () && i < 1 << 14; ++i)
        {
            sortedIndices[i].first = 2;
        }
        for (; i < sortedIndices.size () && i < 1 << 21; ++i)
        {
            sortedIndices[i].first = 3;
        }
        for (; i < sortedIndices.size () && i < 1 << 28; ++i)
        {
            sortedIndices[i].first = 4;
        }
        for (; i < sortedIndices.size (); ++i)
        {
            sortedIndices[i].first = 5;
        }
    }
    sort (sortedIndices.begin (), sortedIndices.end ());

    vector<int> stringIndices (sortedIndices.size ());

    //
    // table will be stored with RLE encoding - store pairs of 'start index,end index'
    // so, the sequence 10,11,12,1,2,3,4  is stored as [ (10,12) , (1,4)]
    //
    // sequential IDs ignore already referenced IDs, so the sequence  11,9,10,12,13 can be stored as [ (11,11) , (9,13)]
    // on reading, don't reference an entry that has already been seen
    // on writing, need to track which entries have already been stored to allow this overlapping to occur
    //

    vector<pair<int, int>> RLEmapping;

    if (sortedIndices.size () > 0)
    {
        RLEmapping.resize (1);
        RLEmapping[0].first  = sortedIndices[0].second;
        RLEmapping[0].second = sortedIndices[0].second;

        fill (stringIndices.begin (), stringIndices.end (), -1);

        stringIndices[sortedIndices[0].second] = 0;

        //
        // as the loop below runs, nextToInclude tracks the value that can be merged with the current run length
        // (RLWmapping.back()) - generally this is on more than the current length, but it jumps forward
        // over values already seen
        //
        int nextToInclude = stringIndices[sortedIndices[0].second] + 1;

        for (size_t i = 1; i < sortedIndices.size (); ++i)
        {
            if (sortedIndices[i].second == nextToInclude)
            {
                //
                // this index can be treated as part of the current run, so extend the run to include it
                //
                RLEmapping.back ().second = sortedIndices[i].second;
            }
            else
            {
                pair<int, int> newEntry (
                    sortedIndices[i].second, sortedIndices[i].second);
                RLEmapping.push_back (newEntry);
            }
            // build mapping for this entry
            stringIndices[sortedIndices[i].second] = i;

            // what would the next entry have to be to be included in this run
            // skip over already mapped strings
            nextToInclude = sortedIndices[i].second + 1;

            while (nextToInclude < int (stringIndices.size ()) &&
                   stringIndices[nextToInclude] >= 0)
            {
                nextToInclude++;
            }
        }
    }
#ifdef DUMP_TABLE
    // dump RLE table for debugging
    for (size_t i = 1; i < sortedIndices.size (); ++i)
    {
        std::cout << i << ' ' << sortedIndices[i].second << std::endl;
    }
#endif

    // now compute size of uncompressed memory block for serialization

    int outputSize =
        8; // at least need four bytes for integer to store number of channel manifests, plus four bytes to indicate version pattern

    outputSize += getStringListSize (prefixedStringList);

    //
    // RLE mapping table size - number of entries followed by eight bytes for each run length
    //
    outputSize += RLEmapping.size () * 8 + 4;

    //
    // track which storage scheme is optimal for storing the IDs of each type
    // ID storage scheme: 0 = 8 bytes per ID, 1 = 4 bytes per ID, 2 = variable
    //

    std::vector<char> storageSchemes;

    for (size_t groupNumber = 0; groupNumber < _manifest.size (); ++groupNumber)
    {
        const ChannelGroupManifest& m = _manifest[groupNumber];
        outputSize += getStringListSize (m._channels); //size of channel group
        outputSize +=
            getStringListSize (m._components); //size of component list
        outputSize += 1;                       //size of lifetime enum
        outputSize += getStringSize (m._hashScheme);
        outputSize += getStringSize (m._encodingScheme);

        outputSize += 1; // ID scheme
        outputSize +=
            4; // size of storage for number of 32 bit entries in ID table

        uint64_t previousId                 = 0;
        uint64_t IdStorageForVariableScheme = 0;
        bool     canUse32Bits               = true;
        for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                 m._table.begin ();
             i != m._table.end ();
             ++i)
        {

            uint64_t idToStore = i->first - previousId;
            IdStorageForVariableScheme +=
                getVariableLengthIntegerSize (idToStore);
            if (idToStore >= 1llu << 32) { canUse32Bits = false; }
            previousId = i->first;

            for (size_t s = 0; s < m._components.size (); ++s)
            {
                int stringID  = stringSet[i->second[s]];
                int idToWrite = stringIndices[stringID];
                outputSize += getVariableLengthIntegerSize (idToWrite);
            }
        }
        // pick best scheme to use to store IDs
        if (canUse32Bits)
        {
            if (IdStorageForVariableScheme < m._table.size () * 4)
            {
                //
                // variable storage smaller than fixed 32 bit, so use that
                //
                storageSchemes.push_back (2);
                outputSize += IdStorageForVariableScheme;
            }
            else
            {
                //
                // variable scheme bigger than fixed 32 bit, but all ID differences fit into 32 bits
                //
                storageSchemes.push_back (1);
                outputSize += m._table.size () * 4;
            }
        }
        else
        {
            if (IdStorageForVariableScheme < m._table.size () * 8)
            {
                //
                // variable storage smaller than fixed 64 bit, so use that
                //
                storageSchemes.push_back (2);
                outputSize += IdStorageForVariableScheme;
            }
            else
            {
                //
                // variable scheme bigger than fixed 64 bit, and some ID differences bigger than 32 bit
                //
                storageSchemes.push_back (0);
                outputSize += m._table.size () * 8;
            }
        }
    }

    //
    // resize output array
    //
    data.resize (outputSize);

    //
    // populate output array
    //
    char* outPtr = &data[0];

    //
    // zeroes to indicate this is version 0 of the header
    //
    Xdr::write<CharPtrIO> (outPtr, int (0));

    //
    // table of strings
    //
    writeStringList (outPtr, prefixedStringList);

    //
    // RLE block
    //
    Xdr::write<CharPtrIO> (outPtr, int (RLEmapping.size ()));
    for (size_t i = 0; i < RLEmapping.size (); ++i)
    {
        Xdr::write<CharPtrIO> (outPtr, RLEmapping[i].first);
        Xdr::write<CharPtrIO> (outPtr, RLEmapping[i].second);
    }

    //
    // number of manifests
    //
    Xdr::write<CharPtrIO> (outPtr, int (_manifest.size ()));
    int manifestIndex = 0;

    for (size_t groupNumber = 0; groupNumber < _manifest.size (); ++groupNumber)
    {
        const ChannelGroupManifest& m = _manifest[groupNumber];
        //
        // manifest header
        //
        writeStringList (outPtr, m._channels);
        writeStringList (outPtr, m._components);
        Xdr::write<CharPtrIO> (outPtr, char (m._lifeTime));
        writePascalString (outPtr, m._hashScheme);
        writePascalString (outPtr, m._encodingScheme);

        char scheme = storageSchemes[manifestIndex];
        Xdr::write<CharPtrIO> (outPtr, scheme);

        Xdr::write<CharPtrIO> (outPtr, int (m._table.size ()));

        uint64_t previousId = 0;
        //
        // table
        //
        for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                 m._table.begin ();
             i != m._table.end ();
             ++i)
        {

            uint64_t idToWrite = i->first - previousId;
            switch (scheme)
            {
                case 0: Xdr::write<CharPtrIO> (outPtr, idToWrite); break;
                case 1:
                    Xdr::write<CharPtrIO> (outPtr, (unsigned int) idToWrite);
                    break;
                case 2: writeVariableLengthInteger (outPtr, idToWrite);
            }

            previousId = i->first;

            for (size_t s = 0; s < m._components.size (); ++s)
            {
                int stringID  = stringSet[i->second[s]];
                int idToWrite = stringIndices[stringID];
                writeVariableLengthInteger (outPtr, idToWrite);
            }
        }
        manifestIndex++;
    }
    //
    // check we've written the ID manifest correctly
    //
    if (outPtr != &data[0] + data.size ())
    {
        throw IEX_NAMESPACE::ArgExc ("Error - IDManifest size error");
    }
}